

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O3

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::Field
          (Field<OpenMD::Vector3<double>_> *this,SimInfo *info,string *filename,string *sele,
          RealType voxelSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SelectionEvaluator *this_00;
  vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  *this_01;
  Vector3i *pVVar2;
  double *pdVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  pointer pcVar7;
  Snapshot *this_02;
  void *__s;
  void *pvVar8;
  undefined8 *puVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint i;
  int iVar15;
  SelectionSet *pSVar16;
  pointer *ppOVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long *plVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  RealType RVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double tmp_4;
  double dVar28;
  double tmp_5;
  Vector<double,_3U> v;
  Vector3<double> result;
  Mat3x3d box;
  Mat3x3d local_1c8;
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  SelectionEvaluator *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  string *local_108;
  string *local_100;
  SelectionSet local_f8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  double local_a8 [4];
  double local_88 [4];
  double local_68 [3];
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__Field_00336d40;
  paVar1 = &(this->selectionScript_).field_2;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar7 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript_,pcVar7,pcVar7 + sele->_M_string_length);
  local_100 = filename;
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  local_108 = &this->selectionScript_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this->voxelSize_ = voxelSize;
  (this->nBins_).super_Vector<int,_3U>.data_[0] = 0;
  (this->nBins_).super_Vector<int,_3U>.data_[1] = 0;
  (this->nBins_).super_Vector<int,_3U>.data_[2] = 0;
  this_01 = &this->field_;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dens_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_).
  super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_f8,this_00);
    lVar23 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar23),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_f8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar23));
      lVar23 = lVar23 + 0x28;
    } while (lVar23 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_f8.bitsets_);
  }
  iVar15 = OpenMDBitSet::countBits
                     ((this->seleMan_).ss_.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_e0 = 0;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = 0;
  bVar5 = (bool)(((this->super_StaticAnalyser).info_)->simParams_->UsePeriodicBoundaryConditions).
                super_ParameterBase.field_0x2b;
  this->usePeriodicBoundaryConditions_ = bVar5;
  if (bVar5 == false) {
    Snapshot::getBoundingBox(&local_1c8,this->snap_);
    lVar23 = 0;
    do {
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar23) =
           *(undefined8 *)
            ((long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar23 + 0x10);
      uVar11 = *(undefined8 *)
                ((long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0] + lVar23 + 8);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar23) =
           *(undefined8 *)
            ((long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar23);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish + lVar23) = uVar11;
      lVar23 = lVar23 + 0x18;
    } while (lVar23 != 0x48);
    Snapshot::getInvBoundingBox(&local_1c8,this->snap_);
  }
  else {
    Snapshot::getHmat(&local_1c8,this->snap_);
    lVar23 = 0;
    do {
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar23) =
           *(undefined8 *)
            ((long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar23 + 0x10);
      uVar11 = *(undefined8 *)
                ((long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0] + lVar23 + 8);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar23) =
           *(undefined8 *)
            ((long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar23);
      *(undefined8 *)
       ((long)&local_f8.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish + lVar23) = uVar11;
      lVar23 = lVar23 + 0x18;
    } while (lVar23 != 0x48);
    Snapshot::getInvHmat(&local_1c8,this->snap_);
  }
  this_02 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
  this->snap_ = this_02;
  if (iVar15 == 0) {
    dVar26 = voxelSize + voxelSize;
  }
  else {
    RVar25 = Snapshot::getVolume(this_02);
    dVar26 = pow(RVar25 / (double)iVar15,0.3333333333333333);
  }
  pVVar2 = &this->nBins_;
  this->reffective_ = dVar26;
  this->rcut_ = dVar26 * 3.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  pSVar16 = &local_f8;
  lVar23 = 0;
  do {
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar23] =
         (double)(pSVar16->bitsets_).
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    dVar4 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
    dVar28 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    dVar26 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    lVar23 = lVar23 + 1;
    pSVar16 = pSVar16 + 1;
  } while (lVar23 != 3);
  local_68[2] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
  ;
  local_68[0] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
  ;
  local_68[1] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
  ;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  ppOVar17 = &local_f8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  lVar23 = 0;
  do {
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar23] =
         (double)*ppOVar17;
    dVar14 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
    dVar13 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    dVar12 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    lVar23 = lVar23 + 1;
    ppOVar17 = ppOVar17 + 3;
  } while (lVar23 != 3);
  local_88[2] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
  ;
  local_88[0] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
  ;
  local_88[1] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
  ;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  ppOVar17 = &local_f8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  lVar23 = 0;
  do {
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar23] =
         (double)*ppOVar17;
    lVar23 = lVar23 + 1;
    ppOVar17 = ppOVar17 + 3;
  } while (lVar23 != 3);
  local_a8[2] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
  ;
  local_a8[0] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
  ;
  local_a8[1] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
  ;
  local_138[0] = dVar28 * dVar14 - dVar13 * dVar4;
  local_138[1] = dVar4 * dVar12 - dVar14 * dVar26;
  local_138[2] = dVar26 * dVar13 - dVar12 * dVar28;
  local_158[0] = dVar13 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] -
                 dVar14 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1];
  local_158[1] = dVar14 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][0] -
                 dVar12 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2];
  local_158[2] = dVar12 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1] -
                 local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] * dVar13;
  local_178[0] = dVar4 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][1] -
                 local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [2] * dVar28;
  local_178[1] = dVar26 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] -
                 local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] * dVar4;
  local_178[2] = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0] * dVar28 -
                 dVar26 * local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][1];
  dVar26 = 0.0;
  lVar23 = 0;
  do {
    dVar26 = dVar26 + local_138[lVar23] * local_138[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  if (dVar26 < 0.0) {
    dVar26 = sqrt(dVar26);
  }
  else {
    dVar26 = SQRT(dVar26);
  }
  lVar23 = 0;
  do {
    local_138[lVar23] = local_138[lVar23] / dVar26;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  dVar26 = 0.0;
  lVar23 = 0;
  do {
    dVar26 = dVar26 + local_158[lVar23] * local_158[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  if (dVar26 < 0.0) {
    dVar26 = sqrt(dVar26);
  }
  else {
    dVar26 = SQRT(dVar26);
  }
  lVar23 = 0;
  do {
    local_158[lVar23] = local_158[lVar23] / dVar26;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  dVar26 = 0.0;
  lVar23 = 0;
  do {
    dVar26 = dVar26 + local_178[lVar23] * local_178[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  if (dVar26 < 0.0) {
    dVar26 = sqrt(dVar26);
  }
  else {
    dVar26 = SQRT(dVar26);
  }
  lVar23 = 0;
  do {
    local_178[lVar23] = local_178[lVar23] / dVar26;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  dVar26 = 0.0;
  lVar23 = 0;
  do {
    dVar26 = dVar26 + local_68[lVar23] * local_158[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  dVar28 = 0.0;
  lVar23 = 0;
  do {
    dVar28 = dVar28 + local_88[lVar23] * local_178[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  auVar27._0_8_ = ABS(dVar26);
  dVar26 = 0.0;
  lVar23 = 0;
  do {
    dVar26 = dVar26 + local_a8[lVar23] * local_138[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  dVar4 = this->voxelSize_;
  auVar27._8_8_ = ABS(dVar28);
  auVar10._8_8_ = dVar4;
  auVar10._0_8_ = dVar4;
  auVar27 = divpd(auVar27,auVar10);
  *(ulong *)(this->nBins_).super_Vector<int,_3U>.data_ =
       CONCAT44((int)auVar27._8_8_,(int)auVar27._0_8_);
  (this->nBins_).super_Vector<int,_3U>.data_[2] = (int)(ABS(dVar26) / dVar4);
  local_118 = this_00;
  local_110 = paVar1;
  std::
  vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ::resize(this_01,(long)(int)auVar27._0_8_);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->dens_,(long)(pVVar2->super_Vector<int,_3U>).data_[0]);
  if (0 < (pVVar2->super_Vector<int,_3U>).data_[0]) {
    uVar19 = (ulong)(uint)(this->nBins_).super_Vector<int,_3U>.data_[1];
    lVar23 = 0;
    do {
      std::
      vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
      ::resize((this_01->
               super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar23,(long)(int)uVar19);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this->dens_).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar23,
               (long)(this->nBins_).super_Vector<int,_3U>.data_[1]);
      uVar6 = (this->nBins_).super_Vector<int,_3U>.data_[1];
      uVar19 = (ulong)uVar6;
      if (0 < (int)uVar6) {
        lVar21 = *(long *)&(this_01->
                           super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar23].
                           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar24 = 0;
        do {
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (lVar21 + lVar24 * 0x18),(long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (lVar24 * 0x18 +
                     *(long *)&(this->dens_).
                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar23].
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data),
                     (long)(this->nBins_).super_Vector<int,_3U>.data_[2]);
          lVar21 = *(long *)&(this->dens_).
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar23].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          __s = *(void **)(lVar21 + lVar24 * 0x18);
          pvVar8 = *(void **)(lVar21 + 8 + lVar24 * 0x18);
          if (__s != pvVar8) {
            memset(__s,0,((long)pvVar8 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
          }
          lVar21 = *(long *)&(this_01->
                             super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar23].
                             super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          puVar9 = *(undefined8 **)(lVar21 + 8 + lVar24 * 0x18);
          for (puVar18 = *(undefined8 **)(lVar21 + lVar24 * 0x18); puVar18 != puVar9;
              puVar18 = puVar18 + 3) {
            *puVar18 = 0;
            puVar18[1] = 0;
            puVar18[2] = 0;
          }
          lVar24 = lVar24 + 1;
          uVar19 = (ulong)(this->nBins_).super_Vector<int,_3U>.data_[1];
        } while (lVar24 < (long)uVar19);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < (pVVar2->super_Vector<int,_3U>).data_[0]);
  }
  getPrefix(&local_50,local_100);
  plVar20 = (long *)std::__cxx11::string::append((char *)&local_50);
  pdVar3 = local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
  pdVar22 = (double *)(plVar20 + 2);
  if ((double *)*plVar20 == pdVar22) {
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = *pdVar22;
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         (double)plVar20[3];
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)pdVar3;
  }
  else {
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = *pdVar22;
    local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)*plVar20;
  }
  local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       (double)plVar20[1];
  *plVar20 = (long)pdVar22;
  plVar20[1] = 0;
  *(undefined1 *)(plVar20 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((double *)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
      != pdVar3) {
    operator_delete((void *)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0],
                    (long)local_1c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Field<T>::Field(SimInfo* info, const std::string& filename,
                  const std::string& sele, RealType voxelSize) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info),
      voxelSize_(voxelSize) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    int nSelected = seleMan_.getSelectionCount();

    Mat3x3d box;
    Mat3x3d invBox;

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    // reff will be used in the gaussian weighting of the
    // should be based on r_{effective}
    snap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (nSelected == 0) {
      reffective_ = 2.0 * voxelSize;
    } else {
      reffective_ = pow((snap_->getVolume() / nSelected), 1. / 3.);
    }
    rcut_ = 3.0 * reffective_;

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nBins_.x() = int(Wa / voxelSize_);
    nBins_.y() = int(Wb / voxelSize_);
    nBins_.z() = int(Wc / voxelSize_);

    // Build the field histogram and dens histogram and fill with zeros.
    field_.resize(nBins_.x());
    dens_.resize(nBins_.x());
    for (int i = 0; i < nBins_.x(); ++i) {
      field_[i].resize(nBins_.y());
      dens_[i].resize(nBins_.y());
      for (int j = 0; j < nBins_.y(); ++j) {
        field_[i][j].resize(nBins_.z());
        dens_[i][j].resize(nBins_.z());

        std::fill(dens_[i][j].begin(), dens_[i][j].end(), 0.0);
        std::fill(field_[i][j].begin(), field_[i][j].end(), T(0.0));
      }
    }

    setOutputName(getPrefix(filename) + ".field");
  }